

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void __thiscall
FFTAnalyzer::AnalyzeOutput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float *pfVar4;
  UnityComplexNumber *pUVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  
  CheckInitialized(this);
  uVar12 = this->spectrumSize;
  uVar7 = uVar12 - numsamples;
  pfVar4 = this->obuffer;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    pfVar4[uVar8] = pfVar4[(long)numsamples + uVar8];
  }
  pfVar4 = this->obuffer;
  uVar8 = 0;
  if (0 < numsamples) {
    uVar8 = (ulong)(uint)numsamples;
  }
  while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
    pfVar4[(int)uVar7] = *data;
    uVar7 = uVar7 + 1;
    data = data + numchannels;
  }
  pUVar5 = this->cspec;
  pfVar4 = this->window;
  pfVar6 = this->obuffer;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar12) {
    uVar9 = (ulong)uVar12;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    pUVar5[uVar8].re = pfVar6[uVar8] * pfVar4[uVar8];
    pUVar5[uVar8].im = 0.0;
  }
  FFTProcess<double>(pUVar5,uVar12,true);
  uVar8 = (long)this->spectrumSize / 2;
  pUVar5 = this->cspec;
  pfVar4 = this->ospec1;
  pfVar6 = this->ospec2;
  uVar10 = 0;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    fVar1 = pUVar5[uVar10].re;
    fVar13 = pUVar5[uVar10].im;
    fVar13 = SQRT(fVar1 * fVar1 + fVar13 * fVar13);
    fVar1 = pfVar6[uVar10];
    uVar12 = -(uint)(fVar1 < fVar13);
    pfVar4[uVar10] = (float)(~uVar12 & (uint)(fVar1 * decaySpeed) | (uint)fVar13 & uVar12);
  }
  uVar2 = this->ispec1;
  uVar3 = this->ispec2;
  auVar14._8_4_ = (int)uVar2;
  auVar14._0_8_ = uVar3;
  auVar14._12_4_ = (int)((ulong)uVar2 >> 0x20);
  this->ispec1 = (float *)uVar3;
  this->ispec2 = (float *)auVar14._8_8_;
  this->ospec1 = pfVar6;
  this->ospec2 = pfVar4;
  if (this->numSpectraReady < 2) {
    this->numSpectraReady = this->numSpectraReady + 1;
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeOutput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        obuffer[n] = obuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        obuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(obuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ospec1[n] = (a > ospec2[n]) ? a : ospec2[n] * decaySpeed;
    }

    float* tmp;
    tmp = ispec1; ispec1 = ispec2; ispec2 = tmp;
    tmp = ospec1; ospec1 = ospec2; ospec2 = tmp;

    if (numSpectraReady < 2)
        numSpectraReady++;
}